

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

l_mem propagatemark(global_State *g)

{
  int iVar1;
  global_State *g_00;
  Table *in_RDI;
  Proto *p;
  lua_State *th;
  Closure *cl;
  Table *h;
  GCObject *o;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  lua_State *in_stack_ffffffffffffffc8;
  GCObject *g_01;
  global_State *in_stack_fffffffffffffff8;
  long lVar2;
  
  g_01 = *(GCObject **)&in_RDI->sizearray;
  (g_01->gch).marked = (g_01->gch).marked | 4;
  g_00 = (global_State *)(ulong)((byte)*(lu_int32 *)&(g_01->gch).tt - 5);
  switch(g_00) {
  case (global_State *)0x0:
    *(GCObject **)&in_RDI->sizearray = (g_01->h).gclist;
    iVar1 = traversetable(in_stack_fffffffffffffff8,in_RDI);
    if (iVar1 != 0) {
      (g_01->gch).marked = (g_01->gch).marked & 0xfb;
    }
    lVar2 = (long)(g_01->h).sizearray * 0x10 + 0x40 + (1L << ((g_01->gch).field_0xb & 0x3f)) * 0x28;
    break;
  case (global_State *)0x1:
    *(Table **)&in_RDI->sizearray = (g_01->h).metatable;
    traverseclosure(g_00,(Closure *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if ((g_01->gch).field_0xa == '\0') {
      iVar1 = ((byte)(g_01->gch).field_0xb - 1) * 8 + 0x30;
    }
    else {
      iVar1 = ((byte)(g_01->gch).field_0xb - 1) * 0x10 + 0x38;
    }
    lVar2 = (long)iVar1;
    break;
  default:
    lVar2 = 0;
    break;
  case (global_State *)0x3:
    *(Value *)&in_RDI->sizearray = ((TValue *)&(g_01->th).gclist)->value;
    ((TValue *)&(g_01->th).gclist)->value = (Value)in_RDI[1].next;
    in_RDI[1].next = g_01;
    (g_01->gch).marked = (g_01->gch).marked & 0xfb;
    traversestack((global_State *)&g_01->gch,in_stack_ffffffffffffffc8);
    lVar2 = (long)*(int *)&((Mbuffer *)&(g_01->p).sizep)->buffer * 0x10 + 0xb8 +
            (long)(g_01->p).sizelocvars * 0x28;
    break;
  case (global_State *)0x4:
    *(GCObject **)&in_RDI->sizearray = (g_01->p).gclist;
    traverseproto(g_00,(Proto *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    lVar2 = (long)(g_01->p).sizecode * 4 + 0x78 +
            (long)*(int *)&((Mbuffer *)&(g_01->p).sizep)->buffer * 8 + (long)(g_01->p).sizek * 0x10
            + (long)(g_01->p).sizelineinfo * 4 + (long)(g_01->p).sizelocvars * 0x10 +
            (long)(g_01->p).sizeupvalues * 8;
  }
  return lVar2;
}

Assistant:

static l_mem propagatemark(global_State*g){
GCObject*o=g->gray;
gray2black(o);
switch(o->gch.tt){
case 5:{
Table*h=gco2h(o);
g->gray=h->gclist;
if(traversetable(g,h))
black2gray(o);
return sizeof(Table)+sizeof(TValue)*h->sizearray+
sizeof(Node)*sizenode(h);
}
case 6:{
Closure*cl=gco2cl(o);
g->gray=cl->c.gclist;
traverseclosure(g,cl);
return(cl->c.isC)?sizeCclosure(cl->c.nupvalues):
sizeLclosure(cl->l.nupvalues);
}
case 8:{
lua_State*th=gco2th(o);
g->gray=th->gclist;
th->gclist=g->grayagain;
g->grayagain=o;
black2gray(o);
traversestack(g,th);
return sizeof(lua_State)+sizeof(TValue)*th->stacksize+
sizeof(CallInfo)*th->size_ci;
}
case(8+1):{
Proto*p=gco2p(o);
g->gray=p->gclist;
traverseproto(g,p);
return sizeof(Proto)+sizeof(Instruction)*p->sizecode+
sizeof(Proto*)*p->sizep+
sizeof(TValue)*p->sizek+
sizeof(int)*p->sizelineinfo+
sizeof(LocVar)*p->sizelocvars+
sizeof(TString*)*p->sizeupvalues;
}
default:return 0;
}
}